

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::SetPhiInDegrees(LE_EulerAngles *this,KFIXED8_3 *Phi)

{
  KFIXED<char,_(unsigned_char)__x03_> local_48;
  KFIXED<char,_(unsigned_char)__x03_> local_38;
  KFIXED<char,_(unsigned_char)__x03_> local_28;
  KFIXED8_3 *local_18;
  KFIXED8_3 *Phi_local;
  LE_EulerAngles *this_local;
  
  local_18 = Phi;
  Phi_local = (KFIXED8_3 *)this;
  KFIXED<char,_(unsigned_char)'\x03'>::KFIXED(&local_48,Phi);
  UTILS::DegToRad<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_28,&this->m_Phi);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_28);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_38);
  KFIXED<char,_(unsigned_char)'\x03'>::~KFIXED(&local_48);
  return;
}

Assistant:

void LE_EulerAngles::SetPhiInDegrees( KFIXED8_3 Phi )
{
    m_Phi = DegToRad( Phi );
}